

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.h
# Opt level: O0

qint64 __thiscall QCborValueConstRef::toInteger(QCborValueConstRef *this,qint64 defaultValue)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  QCborValue *this_00;
  qint64 in_stack_ffffffffffffffb8;
  QCborValue *in_stack_ffffffffffffffc0;
  QCborValue local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &local_20;
  concrete((QCborValueConstRef *)this_00);
  qVar1 = ::QCborValue::toInteger(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ::QCborValue::~QCborValue(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qint64 toInteger(qint64 defaultValue = 0) const
    { return concrete().toInteger(defaultValue); }